

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O0

char * get_config_path(void)

{
  __uid_t __uid;
  passwd *ppVar1;
  passwd *db;
  char *config_path;
  char *base_directory;
  
  config_path = (char *)0x0;
  db = (passwd *)0x0;
  config_path = getenv("XDG_CONFIG_HOME");
  if (config_path == (char *)0x0) {
    config_path = getenv("HOME");
    if (config_path == (char *)0x0) {
      __uid = getuid();
      ppVar1 = getpwuid(__uid);
      if (ppVar1 == (passwd *)0x0) {
        base_directory = (char *)0x0;
      }
      else {
        db = (passwd *)string_init(ppVar1->pw_dir);
        string_append((char **)&db,"/.config/");
        base_directory = (char *)db;
      }
    }
    else {
      db = (passwd *)string_init(config_path);
      string_append((char **)&db,"/.config/");
      base_directory = (char *)db;
    }
  }
  else {
    base_directory = string_init(config_path);
  }
  return base_directory;
}

Assistant:

static char *get_config_path(void)
{
        const char *base_directory = NULL;
        char *config_path = NULL;

        if ((base_directory = getenv("XDG_CONFIG_HOME")) != NULL) {
                config_path = string_init(base_directory);

                return config_path;
        }

        if ((base_directory = getenv("HOME")) != NULL) {
                config_path = string_init(base_directory);
                string_append(&config_path, "/.config/");

                return config_path;
        }

        // If we still haven't found anything use passwd
        struct passwd *db = getpwuid(getuid());

        if (db == NULL) {
                return NULL;
        }

        config_path = string_init(db->pw_dir);
        string_append(&config_path, "/.config/");

        return config_path;
}